

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Lms_ManPrepare(Lms_Man_t *p)

{
  int iVar1;
  uint uVar2;
  Vec_Mem_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Gia_Man_t *p_00;
  int iVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Wrd_t *pVVar9;
  Vec_Str_t *pVVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  
  if (p->fLibConstr != 0) {
    __assert_fail("!p->fLibConstr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x184,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (p->vTruthPo != (Vec_Int_t *)0x0) {
    __assert_fail("p->vTruthPo == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x185,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  pVVar3 = p->vTtMem;
  iVar1 = pVVar3->nEntries;
  lVar12 = (long)iVar1 + 1;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  iVar15 = (int)lVar12;
  iVar6 = 0x10;
  if (0xe < (ulong)(long)iVar1) {
    iVar6 = iVar15;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = iVar6;
  iVar16 = 0;
  if (iVar6 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)iVar6 << 2);
  }
  pVVar7->pArray = piVar8;
  pVVar7->nSize = iVar15;
  memset(piVar8,0xff,lVar12 * 4);
  p->vTruthPo = pVVar7;
  pVVar4 = p->vTruthIds;
  uVar2 = pVVar4->nSize;
  uVar11 = (ulong)uVar2;
  if (uVar11 != 0) {
    iVar16 = *pVVar4->pArray;
    if (1 < (int)uVar2) {
      uVar13 = 1;
      do {
        iVar6 = pVVar4->pArray[uVar13];
        if (iVar6 <= iVar16) {
          iVar16 = iVar6;
        }
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  if (iVar16 < 0) {
    __assert_fail("Vec_IntFindMin(p->vTruthIds) >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x187,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (uVar11 == 0) {
    iVar6 = 0;
  }
  else {
    iVar6 = *pVVar4->pArray;
    if (1 < (int)uVar2) {
      uVar13 = 1;
      do {
        iVar15 = pVVar4->pArray[uVar13];
        if (iVar6 <= iVar15) {
          iVar6 = iVar15;
        }
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  if (pVVar3->nEntries <= iVar6) {
    __assert_fail("Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x188,"void Lms_ManPrepare(Lms_Man_t *)");
  }
  if (0 < pVVar4->nSize) {
    piVar5 = pVVar4->pArray;
    lVar12 = 0;
    do {
      lVar14 = (long)piVar5[lVar12];
      if ((lVar14 < 0) || (pVVar7->nSize <= piVar5[lVar12])) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (piVar8[lVar14] == -1) {
        piVar8[lVar14] = (int)lVar12;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar4->nSize);
  }
  iVar6 = pVVar3->nEntries;
  if ((-1 < (long)iVar6) && (iVar6 <= iVar1)) {
    p_00 = p->pGia;
    piVar8[iVar6] = p_00->vCos->nSize;
    if (p->vDelays != (Vec_Wrd_t *)0x0) {
      __assert_fail("p->vDelays == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,0x18e,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (p->vAreas != (Vec_Str_t *)0x0) {
      __assert_fail("p->vAreas == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,399,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    if (p->vFreqs != (Vec_Int_t *)0x0) {
      __assert_fail("p->vFreqs == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,400,"void Lms_ManPrepare(Lms_Man_t *)");
    }
    pVVar9 = Lms_GiaDelays(p_00);
    p->vDelays = pVVar9;
    pVVar10 = Lms_GiaAreas(p->pGia);
    p->vAreas = pVVar10;
    iVar1 = p->pGia->vCos->nSize;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar6 = 0x10;
    if (0xe < iVar1 - 1U) {
      iVar6 = iVar1;
    }
    pVVar7->nSize = 0;
    pVVar7->nCap = iVar6;
    if (iVar6 == 0) {
      piVar8 = (int *)0x0;
    }
    else {
      piVar8 = (int *)malloc((long)iVar6 << 2);
    }
    pVVar7->pArray = piVar8;
    pVVar7->nSize = iVar1;
    memset(piVar8,0,(long)iVar1 << 2);
    p->vFreqs = pVVar7;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Lms_ManPrepare( Lms_Man_t * p )
{
    // compute the first PO for each semi-canonical form
    int i, Entry;
    assert( !p->fLibConstr );
    assert( p->vTruthPo == NULL );
    p->vTruthPo = Vec_IntStartFull( Vec_MemEntryNum(p->vTtMem)+1 );
    assert( Vec_IntFindMin(p->vTruthIds) >= 0 );
    assert( Vec_IntFindMax(p->vTruthIds) < Vec_MemEntryNum(p->vTtMem) );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
        if ( Vec_IntEntry(p->vTruthPo, Entry) == -1 )
            Vec_IntWriteEntry( p->vTruthPo, Entry, i );
    Vec_IntWriteEntry( p->vTruthPo, Vec_MemEntryNum(p->vTtMem), Gia_ManCoNum(p->pGia) );
    // compute delay/area and init frequency
    assert( p->vDelays == NULL );
    assert( p->vAreas == NULL );
    assert( p->vFreqs == NULL );
    p->vDelays = Lms_GiaDelays( p->pGia );
    p->vAreas  = Lms_GiaAreas( p->pGia );
    p->vFreqs  = Vec_IntStart( Gia_ManCoNum(p->pGia) );
}